

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_visitor.h
# Opt level: O0

void __thiscall
google::protobuf::internal::
VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc:1309:23)>_>
::Visit<google::protobuf::EnumDescriptorProto>
          (VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_command_line_interface_cc:1309:23)>_>
           *this,EnumDescriptor *descriptor,EnumDescriptorProto *proto)

{
  int iVar1;
  EnumValueDescriptor *descriptor_00;
  EnumValueDescriptorProto *proto_00;
  undefined4 local_24;
  int i;
  EnumDescriptorProto *proto_local;
  EnumDescriptor *descriptor_local;
  VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_command_line_interface_cc:1309:23)>_>
  *this_local;
  
  compiler::CommandLineInterface::Run(int,char_const*const*)::$_1::operator()(this,descriptor,proto)
  ;
  local_24 = 0;
  while( true ) {
    iVar1 = EnumDescriptor::value_count(descriptor);
    if (iVar1 <= local_24) break;
    descriptor_00 = EnumDescriptor::value(descriptor,local_24);
    proto_00 = value(this,proto,local_24);
    Visit<google::protobuf::EnumValueDescriptorProto>(this,descriptor_00,proto_00);
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void Visit(const EnumDescriptor& descriptor, Proto&... proto) {
    visitor(descriptor, proto...);
    for (int i = 0; i < descriptor.value_count(); i++) {
      Visit(*descriptor.value(i), value(proto, i)...);
    }
  }